

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O3

void __thiscall
tcu::Matrix<tcu::Interval,_4,_4>::Matrix
          (Matrix<tcu::Interval,_4,_4> *this,Matrix<tcu::Interval,_4,_4> *src)

{
  bool *pbVar1;
  bool *pbVar2;
  double dVar3;
  int row;
  long lVar4;
  Vector<tcu::Interval,_4> *pVVar5;
  undefined8 *puVar6;
  long lVar7;
  int i;
  undefined1 auStack_68 [8];
  undefined8 local_60 [12];
  
  lVar4 = 0;
  pVVar5 = (Vector<tcu::Interval,_4> *)this;
  do {
    lVar7 = 8;
    do {
      *(undefined1 *)
       ((long)((Vector<tcu::Vector<tcu::Interval,_4>,_4> *)pVVar5->m_data)->m_data[0].m_data +
       lVar7 + -8) = 0;
      pbVar1 = &((Vector<tcu::Vector<tcu::Interval,_4>,_4> *)pVVar5->m_data)->m_data[0].m_data[0].
                m_hasNaN + lVar7;
      *(undefined8 *)pbVar1 = 0x7ff0000000000000;
      *(double *)(pbVar1 + 8) = -INFINITY;
      lVar7 = lVar7 + 0x18;
    } while (lVar7 != 0x68);
    lVar7 = 8;
    do {
      *(undefined1 *)
       ((long)((Vector<tcu::Vector<tcu::Interval,_4>,_4> *)pVVar5->m_data)->m_data[0].m_data +
       lVar7 + -8) = 0;
      pbVar1 = &((Vector<tcu::Vector<tcu::Interval,_4>,_4> *)pVVar5->m_data)->m_data[0].m_data[0].
                m_hasNaN + lVar7;
      *(undefined8 *)pbVar1 = 0x7ff0000000000000;
      *(double *)(pbVar1 + 8) = -INFINITY;
      lVar7 = lVar7 + 0x18;
    } while (lVar7 != 0x68);
    lVar4 = lVar4 + 0x60;
    pVVar5 = pVVar5 + 1;
  } while (lVar4 != 0x180);
  lVar4 = 0;
  do {
    lVar7 = 8;
    do {
      auStack_68[lVar7] = 0;
      *(undefined8 *)((long)local_60 + lVar7) = 0x7ff0000000000000;
      *(undefined8 *)((long)local_60 + lVar7 + 8) = 0xfff0000000000000;
      lVar7 = lVar7 + 0x18;
    } while (lVar7 != 0x68);
    lVar7 = 8;
    do {
      auStack_68[lVar7] = 0;
      *(undefined8 *)((long)local_60 + lVar7) = 0x7ff0000000000000;
      *(undefined8 *)((long)local_60 + lVar7 + 8) = 0xfff0000000000000;
      lVar7 = lVar7 + 0x18;
    } while (lVar7 != 0x68);
    puVar6 = local_60;
    pVVar5 = (this->m_data).m_data + lVar4;
    for (lVar7 = 0xc; lVar7 != 0; lVar7 = lVar7 + -1) {
      *(undefined8 *)pVVar5->m_data = *puVar6;
      puVar6 = puVar6 + 1;
      pVVar5 = (Vector<tcu::Interval,_4> *)&pVVar5->m_data[0].m_lo;
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  lVar4 = 0;
  do {
    lVar7 = 0;
    do {
      *(undefined8 *)((long)&((Interval *)this)->m_hi + lVar7) =
           *(undefined8 *)((long)&((Interval *)src)->m_hi + lVar7);
      pbVar1 = &((Vector<tcu::Vector<tcu::Interval,_4>,_4> *)&((Interval *)src)->m_hasNaN)->m_data
                [0].m_data[0].m_hasNaN + lVar7;
      dVar3 = *(double *)(pbVar1 + 8);
      pbVar2 = &((Vector<tcu::Vector<tcu::Interval,_4>,_4> *)&((Interval *)this)->m_hasNaN)->m_data
                [0].m_data[0].m_hasNaN + lVar7;
      *(undefined8 *)pbVar2 = *(undefined8 *)pbVar1;
      *(double *)(pbVar2 + 8) = dVar3;
      lVar7 = lVar7 + 0x60;
    } while (lVar7 != 0x180);
    lVar4 = lVar4 + 1;
    this = (Matrix<tcu::Interval,_4,_4> *)((long)this + 0x18);
    src = (Matrix<tcu::Interval,_4,_4> *)((long)src + 0x18);
  } while (lVar4 != 4);
  return;
}

Assistant:

Matrix<T, Rows, Cols>::Matrix (const Matrix<T, Rows, Cols>& src)
{
	*this = src;
}